

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,SparseSet *q,
                   vector<int,_std::allocator<int>_> *stk)

{
  uint uVar1;
  Inst *pIVar2;
  iterator iVar3;
  pointer pIVar4;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *pvVar5;
  bool bVar6;
  pointer pIVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  iterator iVar12;
  int *piVar13;
  uint local_4c;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_3c;
  Prog *local_38;
  
  q->size_ = 0;
  piVar9 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar12._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar12._M_current != piVar9) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar9;
    iVar12._M_current = piVar9;
  }
  local_4c = root;
  local_48 = flat;
  local_38 = this;
  if (iVar12._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar12,(int *)&local_4c);
    piVar9 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar13 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  else {
    *iVar12._M_current = root;
    piVar13 = iVar12._M_current + 1;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar13;
  }
  if (piVar9 != piVar13) {
    do {
      uVar11 = piVar13[-1];
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = piVar13 + -1;
      while( true ) {
        bVar6 = SparseSet::contains(q,uVar11);
        if (bVar6) break;
        SparseSet::insert_new(q,uVar11);
        pvVar5 = local_48;
        if (uVar11 != local_4c) {
          if ((int)uVar11 < 0) {
            __assert_fail("(i) >= (0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                          ,0x134,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
          }
          if (rootmap->max_size_ <= (int)uVar11) goto LAB_0013b581;
          if (((uint)rootmap->sparse_to_dense_[uVar11] < (uint)rootmap->size_) &&
             ((rootmap->dense_).
              super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
              ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[uVar11]].index_ ==
              uVar11)) {
            iVar3._M_current =
                 (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                        (local_48,iVar3);
              pIVar7 = (pvVar5->
                       super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (iVar3._M_current)->out_opcode_ = 0;
              (iVar3._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
              pIVar7 = (local_48->
                       super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                       _M_impl.super__Vector_impl_data._M_finish + 1;
              (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
              _M_impl.super__Vector_impl_data._M_finish = pIVar7;
            }
            uVar10 = pIVar7[-1].out_opcode_;
            pIVar7[-1].out_opcode_ = uVar10 & 0xfffffff8 | 6;
            if (rootmap->max_size_ <= (int)uVar11) goto LAB_0013b581;
            uVar1 = rootmap->sparse_to_dense_[uVar11];
            if (((uint)rootmap->size_ <= uVar1) ||
               (pIVar4 = (rootmap->dense_).
                         super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               pIVar4[(int)uVar1].index_ != uVar11)) goto LAB_0013b5bf;
            pIVar7[-1].out_opcode_ = uVar10 & 8 | 6 | pIVar4[(int)uVar1].second << 4;
            break;
          }
        }
        pIVar2 = local_38->inst_;
        uVar10 = pIVar2[(int)uVar11].out_opcode_;
        switch(uVar10 & 7) {
        case 1:
          iVar3._M_current =
               (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (local_48,iVar3);
            pIVar7 = (pvVar5->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar3._M_current)->out_opcode_ = 0;
            (iVar3._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            pIVar7 = (local_48->
                     super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1;
            (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_finish = pIVar7;
          }
          iVar8 = (int)((ulong)((long)pIVar7 -
                               (long)(pvVar5->
                                     super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
          pIVar7[-1].out_opcode_ = (pIVar7[-1].out_opcode_ & 8) + iVar8 * 0x10 + 1;
          pIVar7[-1].field_1.out1_ = iVar8 + 1;
          uVar10 = pIVar2[(int)uVar11].out_opcode_;
        case 0:
          if ((uVar10 & 6) != 0) {
            __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                          ,0x6d,"int re2::Prog::Inst::out1()");
          }
          local_3c = pIVar2[(int)uVar11].field_1;
          iVar12._M_current =
               (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar12._M_current ==
              (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (stk,iVar12,&local_3c.cap_);
          }
          else {
            *iVar12._M_current = (int)local_3c;
            (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar12._M_current + 1;
          }
          uVar10 = pIVar2[(int)uVar11].out_opcode_;
        case 6:
          uVar11 = uVar10 >> 4;
          break;
        default:
          iVar3._M_current =
               (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (local_48,iVar3);
            pIVar7 = (pvVar5->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar3._M_current)->out_opcode_ = 0;
            (iVar3._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            pIVar7 = (local_48->
                     super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1;
            (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_finish = pIVar7;
          }
          pIVar7[-1] = pIVar2[(int)uVar11];
          uVar11 = pIVar2[(int)uVar11].out_opcode_ >> 4;
          if (rootmap->max_size_ <= (int)uVar11) {
LAB_0013b581:
            __assert_fail("(i) < (max_size_)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                          ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
          }
          uVar10 = rootmap->sparse_to_dense_[uVar11];
          if (((uint)rootmap->size_ <= uVar10) ||
             (pIVar4 = (rootmap->dense_).
                       super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             pIVar4[(int)uVar10].index_ != uVar11)) {
LAB_0013b5bf:
            __assert_fail("has_index(i)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                          ,0x18d,
                          "Value re2::SparseArray<int>::get_existing(int) const [Value = int]");
          }
          pIVar7 = (pvVar5->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pIVar7[-1].out_opcode_ = pIVar7[-1].out_opcode_ & 0xf | pIVar4[(int)uVar10].second << 4;
          goto LAB_0013b546;
        case 5:
        case 7:
          iVar3._M_current =
               (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (local_48,iVar3);
            pIVar7 = (pvVar5->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar3._M_current)->out_opcode_ = 0;
            (iVar3._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            pIVar7 = (local_48->
                     super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1;
            (local_48->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_finish = pIVar7;
          }
          pIVar7[-1] = pIVar2[(int)uVar11];
          goto LAB_0013b546;
        }
      }
LAB_0013b546:
      piVar13 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish;
    } while ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start != piVar13);
  }
  return;
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap, vector<Inst>* flat,
                    SparseSet* q, vector<int>* stk) {
  q->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32>(flat->size())+1;
        // Fall through.

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}